

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

uint64_t __thiscall roaring::Roaring64Map::rank(Roaring64Map *this,uint64_t x)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  pointer ppVar4;
  uint64_t uVar5;
  uint64_t in_RSI;
  const_iterator iter;
  const_iterator end;
  uint64_t result;
  Roaring *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  _Self local_38;
  _Self local_30;
  uint32_t local_24;
  _Self local_20;
  uint64_t local_18;
  uint64_t local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  local_24 = highBytes(in_RSI);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::lower_bound((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                      *)in_stack_ffffffffffffffa8,(key_type *)0x10c64e);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cend((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)in_stack_ffffffffffffffa8);
  bVar1 = std::operator!=(&local_20,&local_30);
  bVar2 = false;
  if (bVar1) {
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *
                        )0x10c68a);
    in_stack_ffffffffffffffb4 = ppVar4->first;
    uVar3 = highBytes(local_10);
    bVar2 = in_stack_ffffffffffffffb4 == uVar3;
  }
  if (bVar2) {
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *
                        )0x10c6bd);
    in_stack_ffffffffffffffa8 = &ppVar4->second;
    lowBytes(local_10);
    uVar5 = Roaring::rank((Roaring *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    local_18 = uVar5 + local_18;
  }
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cbegin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                 *)in_stack_ffffffffffffffa8);
  while (bVar2 = std::operator!=(&local_38,&local_20), bVar2) {
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)0x10c712
              );
    uVar5 = Roaring::cardinality
                      ((Roaring *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_18 = uVar5 + local_18;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  return local_18;
}

Assistant:

uint64_t rank(uint64_t x) const {
        uint64_t result = 0;
        // Find the first bitmap >= x's bucket. If that is the bucket x would be
        // in, find it's rank in that bucket. Either way, we're left with a
        // range of all buckets strictly smaller than x's bucket, add all their
        // cardinalities together.
        auto end = roarings.lower_bound(highBytes(x));
        if (end != roarings.cend() && end->first == highBytes(x)) {
            result += end->second.rank(lowBytes(x));
        }
        for (auto iter = roarings.cbegin(); iter != end; ++iter) {
            result += iter->second.cardinality();
        }
        return result;
    }